

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall Assimp::ColladaExporter::WriteSpotLight(ColladaExporter *this,aiLight *light)

{
  float fVar1;
  ostream *poVar2;
  double dVar3;
  double dVar4;
  double temp;
  ai_real fallOffAngle;
  aiColor3D *color;
  aiLight *light_local;
  ColladaExporter *this_local;
  
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"<spot>");
  std::operator<<(poVar2,(string *)&this->endstr);
  PushTag(this);
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"<color sid=\"color\">");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(light->mColorDiffuse).r);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(light->mColorDiffuse).g);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(light->mColorDiffuse).b);
  poVar2 = std::operator<<(poVar2,"</color>");
  std::operator<<(poVar2,(string *)&this->endstr);
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"<constant_attenuation>");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,light->mAttenuationConstant);
  poVar2 = std::operator<<(poVar2,"</constant_attenuation>");
  std::operator<<(poVar2,(string *)&this->endstr);
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"<linear_attenuation>");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,light->mAttenuationLinear);
  poVar2 = std::operator<<(poVar2,"</linear_attenuation>");
  std::operator<<(poVar2,(string *)&this->endstr);
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"<quadratic_attenuation>");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,light->mAttenuationQuadratic);
  poVar2 = std::operator<<(poVar2,"</quadratic_attenuation>");
  std::operator<<(poVar2,(string *)&this->endstr);
  fVar1 = light->mAngleInnerCone;
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"<falloff_angle sid=\"fall_off_angle\">");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar1 * 57.29578);
  poVar2 = std::operator<<(poVar2,"</falloff_angle>");
  std::operator<<(poVar2,(string *)&this->endstr);
  dVar3 = cos((double)(light->mAngleOuterCone - light->mAngleInnerCone));
  dVar3 = log(dVar3);
  dVar4 = log(0.1);
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"<falloff_exponent sid=\"fall_off_exponent\">");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,1.0 / (dVar3 / dVar4));
  poVar2 = std::operator<<(poVar2,"</falloff_exponent>");
  std::operator<<(poVar2,(string *)&this->endstr);
  PopTag(this);
  poVar2 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar2 = std::operator<<(poVar2,"</spot>");
  std::operator<<(poVar2,(string *)&this->endstr);
  return;
}

Assistant:

void ColladaExporter::WriteSpotLight(const aiLight *const light){

    const aiColor3D &color=  light->mColorDiffuse;
    mOutput << startstr << "<spot>" << endstr;
    PushTag();
    mOutput << startstr << "<color sid=\"color\">"
                            << color.r<<" "<<color.g<<" "<<color.b
                        <<"</color>" << endstr;
    mOutput << startstr << "<constant_attenuation>"
                                << light->mAttenuationConstant
                            <<"</constant_attenuation>" << endstr;
    mOutput << startstr << "<linear_attenuation>"
                            << light->mAttenuationLinear
                        <<"</linear_attenuation>" << endstr;
    mOutput << startstr << "<quadratic_attenuation>"
                            << light->mAttenuationQuadratic
                        <<"</quadratic_attenuation>" << endstr;
    /*
    out->mAngleOuterCone = AI_DEG_TO_RAD (std::acos(std::pow(0.1f,1.f/srcLight->mFalloffExponent))+
                            srcLight->mFalloffAngle);
    */

    const ai_real fallOffAngle = AI_RAD_TO_DEG(light->mAngleInnerCone);
    mOutput << startstr <<"<falloff_angle sid=\"fall_off_angle\">"
                                << fallOffAngle
                        <<"</falloff_angle>" << endstr;
    double temp = light->mAngleOuterCone-light->mAngleInnerCone;

    temp = std::cos(temp);
    temp = std::log(temp)/std::log(0.1);
    temp = 1/temp;
    mOutput << startstr << "<falloff_exponent sid=\"fall_off_exponent\">"
                            << temp
                        <<"</falloff_exponent>" << endstr;


    PopTag();
    mOutput << startstr << "</spot>" << endstr;

}